

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::WriteLinearOffsets
          (BamStandardIndex *this,int *refId,BaiLinearOffsetVector *linearOffsets)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  reference puVar4;
  undefined8 uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long in_RDI;
  uint64_t linearOffset;
  const_iterator offsetEnd;
  const_iterator offsetIter;
  int32_t offsetCount;
  int64_t numBytesWritten;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff18;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff20;
  allocator *paVar6;
  BaiLinearOffsetVector *in_stack_ffffffffffffff28;
  BamStandardIndex *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar7;
  allocator in_stack_ffffffffffffff57;
  string *in_stack_ffffffffffffff58;
  BamException *in_stack_ffffffffffffff60;
  allocator local_71;
  string local_70 [32];
  unsigned_long local_50;
  unsigned_long *local_48;
  unsigned_long *local_38;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  undefined4 local_28;
  int32_t local_24;
  long local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  
  local_18 = in_RDX;
  SortLinearOffsets(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_20 = 0;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  local_24 = (int32_t)sVar2;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(&local_24);
  }
  lVar3 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),&local_24,4);
  local_20 = lVar3 + local_20;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  local_28 = (undefined4)sVar2;
  SaveLinearOffsetsSummary
            (in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28,
             (int *)in_stack_ffffffffffffff20);
  local_38 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (in_stack_ffffffffffffff18);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            (in_stack_ffffffffffffff20,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_ffffffffffffff18);
  local_48 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (in_stack_ffffffffffffff18);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            (in_stack_ffffffffffffff20,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff20,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff18);
    lVar3 = local_20;
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_30);
    local_50 = *puVar4;
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      SwapEndian_64(&local_50);
    }
    lVar3 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),&local_50,8);
    local_20 = lVar3 + local_20;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_30);
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  if (lVar3 != sVar2 * 8 + 4) {
    uVar7 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    paVar6 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"BamStandardIndex::WriteLinearOffsets",paVar6);
    paVar6 = (allocator *)&stack0xffffffffffffff57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff58,"could not write BAI linear offsets",paVar6);
    BamException::BamException
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (string *)
               CONCAT17(in_stack_ffffffffffffff57,CONCAT16(uVar7,in_stack_ffffffffffffff50)));
    __cxa_throw(uVar5,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::WriteLinearOffsets(const int& refId, BaiLinearOffsetVector& linearOffsets) {

    // make sure linear offsets are sorted before writing & saving summary
    SortLinearOffsets(linearOffsets);

    int64_t numBytesWritten = 0;

    // write number of linear offsets
    int32_t offsetCount = linearOffsets.size();
    if ( m_isBigEndian ) SwapEndian_32(offsetCount);
    numBytesWritten += m_resources.Device->Write((const char*)&offsetCount, sizeof(offsetCount));

    // save summary for reference's linear offsets
    SaveLinearOffsetsSummary(refId, linearOffsets.size());

    // iterate over linear offsets
    BaiLinearOffsetVector::const_iterator offsetIter = linearOffsets.begin();
    BaiLinearOffsetVector::const_iterator offsetEnd  = linearOffsets.end();
    for ( ; offsetIter != offsetEnd; ++offsetIter ) {

        // write linear offset
        uint64_t linearOffset = (*offsetIter);
        if ( m_isBigEndian ) SwapEndian_64(linearOffset);
        numBytesWritten += m_resources.Device->Write((const char*)&linearOffset, sizeof(linearOffset));
    }

    if ( numBytesWritten != (sizeof(offsetCount) + linearOffsets.size()*sizeof(uint64_t)) )
        throw BamException("BamStandardIndex::WriteLinearOffsets", "could not write BAI linear offsets");
}